

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

void __thiscall nivalis::anon_unknown_3::Differentiator::~Differentiator(Differentiator *this)

{
  Environment *in_RDI;
  vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  *unaff_retaddr;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  std::
  unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
  ::~unordered_set((unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
                    *)0x2d4b30);
  Environment::~Environment(in_RDI);
  std::
  vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  ::~vector(unaff_retaddr);
  return;
}

Assistant:

Differentiator(const Expr::AST& ast, uint64_t var_addr,
            Environment& env, std::vector<Expr::ASTNode>& out)
        : nodes(ast), ast_root(&ast[0]), var_addr(var_addr), env(env), out(out) {
        vis_asts.insert(ast_root);
    }